

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
::uninitialized_move_n
          (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
           *this,size_type n,size_type i,size_type j,
          btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
          *x,allocator_type *alloc)

{
  slot_type *psVar1;
  slot_type<S2BooleanOperation::SourceId,_int> *local_50;
  slot_type *dest;
  slot_type *end;
  slot_type *src;
  allocator_type *alloc_local;
  btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
  *x_local;
  size_type j_local;
  size_type i_local;
  size_type n_local;
  btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
  *this_local;
  
  psVar1 = slot(x,(int)j);
  absl::container_internal::SanitizerUnpoisonMemoryRegion(psVar1,n * 0xc);
  end = slot(this,(int)i);
  psVar1 = end + n;
  local_50 = slot(x,(int)j);
  for (; end != psVar1; end = end + 1) {
    absl::container_internal::slot_type<S2BooleanOperation::SourceId,int>::
    construct<std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>>(alloc,local_50,end)
    ;
    local_50 = local_50 + 1;
  }
  return;
}

Assistant:

void uninitialized_move_n(const size_type n, const size_type i,
                            const size_type j, btree_node *x,
                            allocator_type *alloc) {
    absl::container_internal::SanitizerUnpoisonMemoryRegion(
        x->slot(j), n * sizeof(slot_type));
    for (slot_type *src = slot(i), *end = src + n, *dest = x->slot(j);
         src != end; ++src, ++dest) {
      slot_type::construct(alloc, dest, src);
    }
  }